

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::prepareAttribLocation
          (TextureTestBase *this,Program *program,ProgramInterface *program_interface)

{
  GLint GVar1;
  bool bVar2;
  ShaderInterface *pSVar3;
  reference ppVVar4;
  GLint local_48;
  GLuint local_44;
  GLint location;
  GLuint index;
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
  local_38;
  iterator it;
  PtrVector *inputs;
  ShaderInterface *si;
  ProgramInterface *program_interface_local;
  Program *program_local;
  TextureTestBase *this_local;
  
  pSVar3 = Utils::ProgramInterface::GetShaderInterface(program_interface,VERTEX);
  it._M_current = (Variable **)&pSVar3->m_inputs;
  local_38._M_current =
       (Variable **)
       std::
       vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
       ::begin((vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                *)it._M_current);
  while( true ) {
    _location = std::
                vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ::end(it._M_current);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                        *)&location,&local_38);
    if (!bVar2) break;
    ppVVar4 = __gnu_cxx::
              __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
              ::operator*(&local_38);
    if (((*ppVVar4)->m_descriptor).m_expected_location == -1) {
      ppVVar4 = __gnu_cxx::
                __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                ::operator*(&local_38);
      local_44 = Utils::Program::GetResourceIndex(program,&((*ppVVar4)->m_descriptor).m_name,0x92e3)
      ;
      local_48 = 0;
      Utils::Program::GetResource(program,0x92e3,local_44,0x930e,1,&local_48);
      GVar1 = local_48;
      ppVVar4 = __gnu_cxx::
                __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
                ::operator*(&local_38);
      ((*ppVVar4)->m_descriptor).m_expected_location = GVar1;
    }
    __gnu_cxx::
    __normal_iterator<gl4cts::EnhancedLayouts::Utils::Variable_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void TextureTestBase::prepareAttribLocation(Utils::Program& program, Utils::ProgramInterface& program_interface)
{
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	Utils::Variable::PtrVector& inputs = si.m_inputs;

	for (Utils::Variable::PtrVector::iterator it = inputs.begin(); inputs.end() != it; ++it)
	{
		/* Test does not specify location, query value and set */
		if (Utils::Variable::m_automatic_location == (*it)->m_descriptor.m_expected_location)
		{
			GLuint index	= program.GetResourceIndex((*it)->m_descriptor.m_name, GL_PROGRAM_INPUT);
			GLint  location = 0;

			program.GetResource(GL_PROGRAM_INPUT, index, GL_LOCATION, 1 /* size */, &location);

			(*it)->m_descriptor.m_expected_location = location;
		}
	}
}